

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O3

void duckdb::TemplatedFetchCommittedRange<unsigned_char>
               (UpdateInfo *info,idx_t start,idx_t end,idx_t result_offset,Vector *result)

{
  uint uVar1;
  data_ptr_t pdVar2;
  ulong uVar3;
  sel_t sVar4;
  ulong uVar5;
  
  sVar4 = info->N;
  if (sVar4 != 0) {
    uVar1 = info->max;
    pdVar2 = result->data;
    uVar3 = 0;
    do {
      uVar5 = (ulong)*(uint *)((long)&info[1].segment + uVar3 * 4);
      if (start <= uVar5) {
        if (end <= uVar5) {
          return;
        }
        pdVar2[uVar5 + (result_offset - start)] =
             *(data_t *)((long)&info[1].segment + uVar3 + (ulong)uVar1 * 4);
        sVar4 = info->N;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < sVar4);
  }
  return;
}

Assistant:

static void MergeUpdateInfoRange(UpdateInfo &current, idx_t start, idx_t end, idx_t result_offset, T *result_data) {
	auto tuples = current.GetTuples();
	auto info_data = current.GetData<T>();
	for (idx_t i = 0; i < current.N; i++) {
		auto tuple_idx = tuples[i];
		if (tuple_idx < start) {
			continue;
		} else if (tuple_idx >= end) {
			break;
		}
		auto result_idx = result_offset + tuple_idx - start;
		result_data[result_idx] = info_data[i];
	}
}